

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseMathMulDiv(Parser *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  runtime_error *prVar4;
  element_type *this_00;
  shared_ptr<minja::Expression> *__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar5;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  parts;
  FilterExpr *filter;
  shared_ptr<minja::Expression> expr;
  Op op;
  shared_ptr<minja::Expression> right;
  string op_str;
  shared_ptr<minja::Expression> left;
  shared_ptr<minja::BinaryOpExpr> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  shared_ptr<minja::Expression> *this_01;
  undefined7 in_stack_fffffffffffffe58;
  Op *in_stack_fffffffffffffe60;
  FilterExpr *this_02;
  undefined4 in_stack_fffffffffffffe68;
  flag_type in_stack_fffffffffffffe6c;
  flag_type in_stack_fffffffffffffe70;
  flag_type in_stack_fffffffffffffe74;
  Location *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  Parser *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffec8;
  SpaceHandling in_stack_fffffffffffffecc;
  regex *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  SpaceHandling in_stack_fffffffffffffedc;
  string *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  __shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_f1 [33];
  string local_d0 [76];
  flag_type local_84;
  __shared_ptr local_80 [16];
  string local_70 [32];
  string local_50 [48];
  __shared_ptr local_20 [8];
  Parser *in_stack_ffffffffffffffe8;
  
  parseMathUnaryPlusMinus((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (!bVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Expected left side of \'math mul/div\' expression");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((parseMathMulDiv()::mul_div_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseMathMulDiv()::mul_div_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseMathMulDiv()::mul_div_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseMathMulDiv()::mul_div_tok_abi_cxx11_);
  }
  std::__cxx11::string::string(local_50);
  while( true ) {
    consumeToken((Parser *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    std::__cxx11::string::operator=(local_50,local_70);
    bVar2 = std::__cxx11::string::empty();
    bVar2 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_70);
    if ((bVar2 & 1) == 0) {
      this_02 = (FilterExpr *)local_f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffe80),(char *)in_stack_fffffffffffffe78,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      consumeToken((Parser *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      bVar2 = std::__cxx11::string::empty();
      bVar2 = bVar2 ^ 0xff;
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string((string *)(local_f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f1);
      if ((bVar2 & 1) == 0) {
        std::shared_ptr<minja::Expression>::shared_ptr
                  ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffe40,
                   (shared_ptr<minja::Expression> *)in_stack_fffffffffffffe38);
      }
      else {
        parseMathMulDiv(in_stack_ffffffffffffffe8);
        this_00 = std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::get(&local_108);
        if (this_00 == (element_type *)0x0) {
          __args = (shared_ptr<minja::Expression> *)0x0;
        }
        else {
          __args = (shared_ptr<minja::Expression> *)
                   __dynamic_cast(this_00,&Expression::typeinfo,&FilterExpr::typeinfo,0);
        }
        if (__args == (shared_ptr<minja::Expression> *)0x0) {
          this_01 = (shared_ptr<minja::Expression> *)&stack0xfffffffffffffed0;
          std::
          vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
          ::vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                    *)0x2ee0d5);
          std::
          vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
          ::emplace_back<std::shared_ptr<minja::Expression>>
                    ((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                      *)this_00,__args);
          std::
          vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
          ::emplace_back<std::shared_ptr<minja::Expression>>
                    ((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                      *)this_00,__args);
          get_location(in_stack_fffffffffffffe88);
          std::
          make_shared<minja::FilterExpr,minja::Location,std::vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>>
                    ((Location *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                      *)this_02);
          std::shared_ptr<minja::Expression>::shared_ptr<minja::FilterExpr,void>
                    (this_01,(shared_ptr<minja::FilterExpr> *)in_stack_fffffffffffffe38);
          std::shared_ptr<minja::FilterExpr>::~shared_ptr((shared_ptr<minja::FilterExpr> *)0x2ee14c)
          ;
          Location::~Location((Location *)0x2ee156);
          std::
          vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
          ::~vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                     *)this_00);
        }
        else {
          FilterExpr::prepend(this_02,(shared_ptr<minja::Expression> *)
                                      CONCAT17(bVar2,in_stack_fffffffffffffe58));
          std::shared_ptr<minja::Expression>::shared_ptr
                    ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffe40,
                     (shared_ptr<minja::Expression> *)in_stack_fffffffffffffe38);
        }
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2ee1c0);
      }
      std::__cxx11::string::~string(local_50);
      std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2ee208);
      sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<minja::Expression>)
             sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    parseMathUnaryPlusMinus((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
    ;
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_80);
    if (!bVar1) break;
    bVar1 = std::operator==(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    if (bVar1) {
      in_stack_fffffffffffffe74 = 3;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      if (bVar1) {
        in_stack_fffffffffffffe70 = 4;
        in_stack_fffffffffffffe74 = 4;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        if (bVar1) {
          in_stack_fffffffffffffe6c = 5;
          in_stack_fffffffffffffe70 = in_stack_fffffffffffffe6c;
          in_stack_fffffffffffffe74 = in_stack_fffffffffffffe6c;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
          in_stack_fffffffffffffe6c = 7;
          in_stack_fffffffffffffe70 = in_stack_fffffffffffffe6c;
          in_stack_fffffffffffffe74 = in_stack_fffffffffffffe6c;
          if (bVar1) {
            in_stack_fffffffffffffe6c = 6;
            in_stack_fffffffffffffe70 = in_stack_fffffffffffffe6c;
            in_stack_fffffffffffffe74 = in_stack_fffffffffffffe6c;
          }
        }
      }
    }
    local_84 = in_stack_fffffffffffffe74;
    get_location(in_stack_fffffffffffffe88);
    std::
    make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op&>
              (in_stack_fffffffffffffe78,
               (shared_ptr<minja::Expression> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (shared_ptr<minja::Expression> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe60);
    std::shared_ptr<minja::Expression>::operator=
              ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
    ;
    std::shared_ptr<minja::BinaryOpExpr>::~shared_ptr((shared_ptr<minja::BinaryOpExpr> *)0x2eded1);
    Location::~Location((Location *)0x2edede);
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2edeeb);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Expected right side of \'math mul/div\' expression");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Expression> parseMathMulDiv() {
        auto left = parseMathUnaryPlusMinus();
        if (!left) throw std::runtime_error("Expected left side of 'math mul/div' expression");

        static std::regex mul_div_tok(R"(\*\*?|//?|%(?!\}))");
        std::string op_str;
        while (!(op_str = consumeToken(mul_div_tok)).empty()) {
            auto right = parseMathUnaryPlusMinus();
            if (!right) throw std::runtime_error("Expected right side of 'math mul/div' expression");
            auto op = op_str == "*" ? BinaryOpExpr::Op::Mul
                : op_str == "**" ? BinaryOpExpr::Op::MulMul
                : op_str == "/" ? BinaryOpExpr::Op::Div
                : op_str == "//" ? BinaryOpExpr::Op::DivDiv
                : BinaryOpExpr::Op::Mod;
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }

        if (!consumeToken("|").empty()) {
            auto expr = parseMathMulDiv();
            if (auto filter = dynamic_cast<FilterExpr*>(expr.get())) {
                filter->prepend(std::move(left));
                return expr;
            } else {
                std::vector<std::shared_ptr<Expression>> parts;
                parts.emplace_back(std::move(left));
                parts.emplace_back(std::move(expr));
                return std::make_shared<FilterExpr>(get_location(), std::move(parts));
            }
        }
        return left;
    }